

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeAddOpList(Vdbe *p,int nOp,VdbeOpList *aOp)

{
  int iVar1;
  Op *pOVar2;
  VdbeOp *pOut;
  VdbeOpList *pVStack_38;
  int p2;
  VdbeOpList *pIn;
  int i;
  int addr;
  VdbeOpList *aOp_local;
  int nOp_local;
  Vdbe *p_local;
  
  if ((p->nOpAlloc < p->nOp + nOp) && (iVar1 = growOpArray(p), iVar1 != 0)) {
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = p->nOp;
    if (0 < nOp) {
      pVStack_38 = aOp;
      for (pIn._0_4_ = 0; (int)pIn < nOp; pIn._0_4_ = (int)pIn + 1) {
        iVar1 = (int)pVStack_38->p2;
        pOVar2 = p->aOp + ((int)pIn + p_local._4_4_);
        pOVar2->opcode = pVStack_38->opcode;
        pOVar2->p1 = (int)pVStack_38->p1;
        if ((iVar1 < 0) && ((""[pOVar2->opcode] & 1) != 0)) {
          pOVar2->p2 = p_local._4_4_ + (-1 - iVar1);
        }
        else {
          pOVar2->p2 = iVar1;
        }
        pOVar2->p3 = (int)pVStack_38->p3;
        pOVar2->p4type = '\0';
        (pOVar2->p4).p = (void *)0x0;
        pOVar2->p5 = '\0';
        pVStack_38 = pVStack_38 + 1;
      }
      p->nOp = nOp + p->nOp;
    }
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOpList(Vdbe *p, int nOp, VdbeOpList const *aOp){
  int addr;
  assert( p->magic==VDBE_MAGIC_INIT );
  if( p->nOp + nOp > p->nOpAlloc && growOpArray(p) ){
    return 0;
  }
  addr = p->nOp;
  if( ALWAYS(nOp>0) ){
    int i;
    VdbeOpList const *pIn = aOp;
    for(i=0; i<nOp; i++, pIn++){
      int p2 = pIn->p2;
      VdbeOp *pOut = &p->aOp[i+addr];
      pOut->opcode = pIn->opcode;
      pOut->p1 = pIn->p1;
      if( p2<0 && (sqlite3OpcodeProperty[pOut->opcode] & OPFLG_JUMP)!=0 ){
        pOut->p2 = addr + ADDR(p2);
      }else{
        pOut->p2 = p2;
      }
      pOut->p3 = pIn->p3;
      pOut->p4type = P4_NOTUSED;
      pOut->p4.p = 0;
      pOut->p5 = 0;
#ifdef SQLITE_DEBUG
      pOut->zComment = 0;
      if( p->db->flags & SQLITE_VdbeAddopTrace ){
        sqlite3VdbePrintOp(0, i+addr, &p->aOp[i+addr]);
      }
#endif
    }
    p->nOp += nOp;
  }
  return addr;
}